

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_reduce.cpp
# Opt level: O0

void __thiscall tst_helpers_reduce::sequenceTypes(tst_helpers_reduce *this)

{
  tst_helpers_reduce *this_local;
  
  anon_unknown.dwarf_31f78::SequenceTester<QList<QtPromise::QPromise<int>_>_>::exec();
  anon_unknown.dwarf_31f78::SequenceTester<QList<QtPromise::QPromise<int>_>_>::exec();
  anon_unknown.dwarf_31f78::
  SequenceTester<std::__cxx11::list<QtPromise::QPromise<int>,_std::allocator<QtPromise::QPromise<int>_>_>_>
  ::exec();
  anon_unknown.dwarf_31f78::
  SequenceTester<std::vector<QtPromise::QPromise<int>,_std::allocator<QtPromise::QPromise<int>_>_>_>
  ::exec();
  return;
}

Assistant:

void tst_helpers_reduce::sequenceTypes()
{
#if (QT_VERSION < QT_VERSION_CHECK(5, 15, 0))
    // QLinkedList is deprecated since Qt 5.15.
    SequenceTester<QLinkedList<QtPromise::QPromise<int>>>::exec();
#endif
    SequenceTester<QList<QtPromise::QPromise<int>>>::exec();
    SequenceTester<QVector<QtPromise::QPromise<int>>>::exec();
    SequenceTester<std::list<QtPromise::QPromise<int>>>::exec();
    SequenceTester<std::vector<QtPromise::QPromise<int>>>::exec();
}